

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

void readMessages(void)

{
  int iVar1;
  int __n;
  int __fd;
  code **ppcVar2;
  MessageReceiver rx;
  undefined8 local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 uStack_b0;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  code *local_88;
  MessageReceiver local_80;
  
  unixsocketipc::MessageReceiver::MessageReceiver(&local_80);
  local_98 = 0;
  local_a0 = callback;
  local_88 = std::
             _Function_handler<void_(unsigned_int,_const_char_*,_unsigned_int),_void_(*)(unsigned_int,_const_char_*,_unsigned_int)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<void_(unsigned_int,_const_char_*,_unsigned_int),_void_(*)(unsigned_int,_const_char_*,_unsigned_int)>
             ::_M_manager;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = (code *)0x0;
  uStack_b0 = 0;
  __fd = 0x10302e;
  iVar1 = unixsocketipc::MessageReceiver::init
                    (&local_80,(EVP_PKEY_CTX *)"/tmp/MessageSenderReceiverSocket");
  if (local_b8 != (code *)0x0) {
    __fd = (int)&local_c8;
    (*local_b8)(&local_c8,&local_c8,3);
  }
  if (local_90 != (code *)0x0) {
    ppcVar2 = &local_a0;
    (*local_90)(ppcVar2,ppcVar2,3);
    __fd = (int)ppcVar2;
  }
  if ((char)iVar1 == '\0') {
    puts("rx.init failed.");
  }
  else {
    puts("reader ready. waiting for connection...");
    unixsocketipc::MessageReceiver::listen(&local_80,__fd,__n);
  }
  unixsocketipc::MessageReceiver::~MessageReceiver(&local_80);
  return;
}

Assistant:

void readMessages() {
   MessageReceiver rx;
   if (!rx.init("/tmp/MessageSenderReceiverSocket", callback)) {
      printf("rx.init failed.\n");
      return;
   }

   printf("reader ready. waiting for connection...\n");
   rx.listen();
}